

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O0

void __thiscall deci::program_t::program_t(program_t *this,command_t *source,size_t sourceSize)

{
  size_t __first;
  command_t *__last;
  value_t *pvVar1;
  allocator<deci::command_t> local_21;
  size_t local_20;
  size_t sourceSize_local;
  command_t *source_local;
  program_t *this_local;
  
  local_20 = sourceSize;
  sourceSize_local = (size_t)source;
  source_local = (command_t *)this;
  function_t::function_t(&this->super_function_t);
  __first = sourceSize_local;
  (this->super_function_t).super_value_t._vptr_value_t = (_func_int **)&PTR_DoHashing_0011d608;
  this->refCount = 0;
  __last = (command_t *)(sourceSize_local + local_20 * 0x10);
  std::allocator<deci::command_t>::allocator(&local_21);
  std::vector<deci::command_t,std::allocator<deci::command_t>>::vector<deci::command_t_const*,void>
            ((vector<deci::command_t,std::allocator<deci::command_t>> *)&this->source,
             (command_t *)__first,__last,&local_21);
  std::allocator<deci::command_t>::~allocator(&local_21);
  pvVar1 = nothing_t::Instance();
  this->result = pvVar1;
  return;
}

Assistant:

program_t::program_t(const command_t* source, size_t sourceSize)
    : refCount(0)
    , source(source, source + sourceSize)
    , result(&nothing_t::Instance()) {
      ;
  }